

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialaddress.cpp
# Opt level: O0

void __thiscall
ElementsConfidentialAddress_P2wshAddressToConfidential_Test::TestBody
          (ElementsConfidentialAddress_P2wshAddressToConfidential_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_ad8;
  Message local_ad0;
  ElementsAddressType local_ac8;
  AddressType local_ac4;
  undefined1 local_ac0 [8];
  AssertionResult gtest_ar_5;
  Message local_aa8;
  ElementsNetType local_aa0;
  NetType local_a9c;
  undefined1 local_a98 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_a68;
  Message local_a60;
  string local_a58;
  bool local_a31;
  undefined1 local_a30 [8];
  AssertionResult gtest_ar_;
  Message local_a18;
  Address local_a10;
  string local_890;
  undefined1 local_870 [8];
  AssertionResult gtest_ar_3;
  Message local_858;
  ByteData local_850;
  string local_838;
  undefined1 local_818 [8];
  AssertionResult gtest_ar_2;
  Message local_800;
  ConfidentialKey local_7f8;
  string local_7e0;
  undefined1 local_7c0 [8];
  AssertionResult gtest_ar_1;
  Message local_7a8;
  string local_7a0;
  undefined1 local_780 [8];
  AssertionResult gtest_ar;
  Message local_768;
  ElementsConfidentialAddress local_760;
  AssertHelper local_5a8;
  Message local_5a0 [2];
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> local_590;
  allocator local_571;
  string local_570;
  Script local_550;
  Address local_518;
  allocator local_391;
  string local_390;
  undefined1 local_370 [8];
  ConfidentialKey confidential_key;
  undefined1 local_348 [8];
  ElementsConfidentialAddress confidential_address;
  Address address;
  ElementsConfidentialAddress_P2wshAddressToConfidential_Test *this_local;
  
  cfd::core::Address::Address((Address *)((long)&confidential_address.address_.field_2 + 8));
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_348);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_390,
             "03a398eed59a2368563bbd2bc68a7ccdbbd6dcbf43b298edc810d22edb6d761800",&local_391);
  cfd::core::Pubkey::Pubkey((Pubkey *)local_370,&local_390);
  std::__cxx11::string::~string((string *)&local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_570,"a91429b1ec079a9c6a45a4e9ab38c3aa3e0ad3dc61f088",&local_571);
      cfd::core::Script::Script(&local_550,&local_570);
      cfd::core::GetElementsAddressFormatList();
      cfd::core::Address::Address
                (&local_518,kCfdInvalidSettingError,kVersion0,&local_550,&local_590);
      cfd::core::Address::operator=
                ((Address *)((long)&confidential_address.address_.field_2 + 8),&local_518);
      cfd::core::Address::~Address(&local_518);
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector(&local_590);
      cfd::core::Script::~Script(&local_550);
      std::__cxx11::string::~string((string *)&local_570);
      std::allocator<char>::~allocator((allocator<char> *)&local_571);
    }
  }
  else {
    testing::Message::Message(local_5a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_5a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x208,
               "Expected: (address = Address(ElementsNetType::kElementsRegtest, WitnessVersion::kVersion0, Script(\"a91429b1ec079a9c6a45a4e9ab38c3aa3e0ad3dc61f088\"), GetElementsAddressFormatList())) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_5a8,local_5a0);
    testing::internal::AssertHelper::~AssertHelper(&local_5a8);
    testing::Message::~Message(local_5a0);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
                (&local_760,(Address *)((long)&confidential_address.address_.field_2 + 8),
                 (ConfidentialKey *)local_370);
      cfd::core::ElementsConfidentialAddress::operator=
                ((ElementsConfidentialAddress *)local_348,&local_760);
      cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&local_760);
    }
  }
  else {
    testing::Message::Message(&local_768);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x20b,
               "Expected: (confidential_address = ElementsConfidentialAddress(address, confidential_key)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,&local_768);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(&local_768);
  }
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_
            (&local_7a0,(ElementsConfidentialAddress *)local_348);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_780,
             "\"el1qqw3e3mk4ng3ks43mh54udznuekaadh9lgwef3mwgzrfzakmdwcvqqve2xzutyaf7vjcap67f28q90uxec2ve95g3rpu5crapcmfr2l9xl5jzazvcpysz\""
             ,"confidential_address.GetAddress().c_str()",
             "el1qqw3e3mk4ng3ks43mh54udznuekaadh9lgwef3mwgzrfzakmdwcvqqve2xzutyaf7vjcap67f28q90uxec2ve95g3rpu5crapcmfr2l9xl5jzazvcpysz"
             ,pcVar2);
  std::__cxx11::string::~string((string *)&local_7a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_780);
  if (!bVar1) {
    testing::Message::Message(&local_7a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_780);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x20e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_7a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_7a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_780);
  cfd::core::ElementsConfidentialAddress::GetConfidentialKey
            (&local_7f8,(ElementsConfidentialAddress *)local_348);
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_7e0,&local_7f8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_7c0,
             "\"03a398eed59a2368563bbd2bc68a7ccdbbd6dcbf43b298edc810d22edb6d761800\"",
             "confidential_address.GetConfidentialKey().GetHex().c_str()",
             "03a398eed59a2368563bbd2bc68a7ccdbbd6dcbf43b298edc810d22edb6d761800",pcVar2);
  std::__cxx11::string::~string((string *)&local_7e0);
  cfd::core::Pubkey::~Pubkey(&local_7f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7c0);
  if (!bVar1) {
    testing::Message::Message(&local_800);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x211,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_800);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_800);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7c0);
  cfd::core::ElementsConfidentialAddress::GetHash
            (&local_850,(ElementsConfidentialAddress *)local_348);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_838,&local_850);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_818,
             "\"332a30b8b2753e64b1d0ebc951c057f0d9c29992d11118794c0fa1c6d2357ca6\"",
             "confidential_address.GetHash().GetHex().c_str()",
             "332a30b8b2753e64b1d0ebc951c057f0d9c29992d11118794c0fa1c6d2357ca6",pcVar2);
  std::__cxx11::string::~string((string *)&local_838);
  cfd::core::ByteData::~ByteData(&local_850);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_818);
  if (!bVar1) {
    testing::Message::Message(&local_858);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_818);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x213,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_858);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_858);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_818);
  cfd::core::ElementsConfidentialAddress::GetUnblindedAddress
            (&local_a10,(ElementsConfidentialAddress *)local_348);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_890,&local_a10);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_870,
             "\"ert1qxv4rpw9jw5lxfvwsa0y4rszh7rvu9xvj6yg3s72vp7sud5340jnquagp6g\"",
             "confidential_address.GetUnblindedAddress().GetAddress().c_str()",
             "ert1qxv4rpw9jw5lxfvwsa0y4rszh7rvu9xvj6yg3s72vp7sud5340jnquagp6g",pcVar2);
  std::__cxx11::string::~string((string *)&local_890);
  cfd::core::Address::~Address(&local_a10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_870);
  if (!bVar1) {
    testing::Message::Message(&local_a18);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_870);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x215,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_a18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_a18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_870);
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_
            (&local_a58,(ElementsConfidentialAddress *)local_348);
  local_a31 = cfd::core::ElementsConfidentialAddress::IsConfidentialAddress(&local_a58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_a30,&local_a31,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_a58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a30);
  if (!bVar1) {
    testing::Message::Message(&local_a60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_4.message_,(internal *)local_a30,
               (AssertionResult *)
               "ElementsConfidentialAddress::IsConfidentialAddress(confidential_address.GetAddress())"
               ,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x217,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a68,&local_a60);
    testing::internal::AssertHelper::~AssertHelper(&local_a68);
    std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_a60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a30);
  local_a9c = kElementsRegtest;
  local_aa0 = cfd::core::ElementsConfidentialAddress::GetNetType
                        ((ElementsConfidentialAddress *)local_348);
  testing::internal::EqHelper<false>::Compare<cfd::core::NetType,cfd::core::NetType>
            ((EqHelper<false> *)local_a98,"ElementsNetType::kElementsRegtest",
             "confidential_address.GetNetType()",&local_a9c,&local_aa0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a98);
  if (!bVar1) {
    testing::Message::Message(&local_aa8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x218,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_aa8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_aa8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a98);
  local_ac4 = kP2wshAddress;
  local_ac8 = cfd::core::ElementsConfidentialAddress::GetAddressType
                        ((ElementsConfidentialAddress *)local_348);
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            ((EqHelper<false> *)local_ac0,"ElementsAddressType::kP2wshAddress",
             "confidential_address.GetAddressType()",&local_ac4,&local_ac8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ac0);
  if (!bVar1) {
    testing::Message::Message(&local_ad0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ac0);
    testing::internal::AssertHelper::AssertHelper
              (&local_ad8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x219,pcVar2);
    testing::internal::AssertHelper::operator=(&local_ad8,&local_ad0);
    testing::internal::AssertHelper::~AssertHelper(&local_ad8);
    testing::Message::~Message(&local_ad0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ac0);
  cfd::core::Pubkey::~Pubkey((Pubkey *)local_370);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_348);
  cfd::core::Address::~Address((Address *)((long)&confidential_address.address_.field_2 + 8));
  return;
}

Assistant:

TEST(ElementsConfidentialAddress, P2wshAddressToConfidential) {
  Address address;
  ElementsConfidentialAddress confidential_address;
  ConfidentialKey confidential_key(
      "03a398eed59a2368563bbd2bc68a7ccdbbd6dcbf43b298edc810d22edb6d761800");

  EXPECT_NO_THROW(
      (address =
          Address(ElementsNetType::kElementsRegtest, WitnessVersion::kVersion0,
                  Script("a91429b1ec079a9c6a45a4e9ab38c3aa3e0ad3dc61f088"),
                  GetElementsAddressFormatList())));
  EXPECT_NO_THROW(
      (confidential_address =
          ElementsConfidentialAddress(address, confidential_key)));
  EXPECT_STREQ(
      "el1qqw3e3mk4ng3ks43mh54udznuekaadh9lgwef3mwgzrfzakmdwcvqqve2xzutyaf7vjcap67f28q90uxec2ve95g3rpu5crapcmfr2l9xl5jzazvcpysz",
      confidential_address.GetAddress().c_str());
  EXPECT_STREQ(
      "03a398eed59a2368563bbd2bc68a7ccdbbd6dcbf43b298edc810d22edb6d761800",
      confidential_address.GetConfidentialKey().GetHex().c_str());
  EXPECT_STREQ("332a30b8b2753e64b1d0ebc951c057f0d9c29992d11118794c0fa1c6d2357ca6",
               confidential_address.GetHash().GetHex().c_str());
  EXPECT_STREQ("ert1qxv4rpw9jw5lxfvwsa0y4rszh7rvu9xvj6yg3s72vp7sud5340jnquagp6g",
               confidential_address.GetUnblindedAddress().GetAddress().c_str());
  EXPECT_TRUE(
      ElementsConfidentialAddress::IsConfidentialAddress(confidential_address.GetAddress()));
  EXPECT_EQ(ElementsNetType::kElementsRegtest, confidential_address.GetNetType());
  EXPECT_EQ(ElementsAddressType::kP2wshAddress, confidential_address.GetAddressType());
}